

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O0

void print_exponential_number
               (output_gadget_t *output,floating_point_t number,printf_size_t precision,
               printf_size_t width,printf_flags_t flags,char *buf,printf_size_t len)

{
  printf_size_t pVar1;
  floating_point_components number_;
  undefined4 uVar2;
  char c;
  int iVar3;
  bool negative_00;
  floating_point_t x;
  scaling_factor normalization_00;
  printf_unsigned_value_t local_108;
  printf_size_t local_f8;
  printf_size_t local_f4;
  int local_f0;
  uint local_ec;
  floating_point_t local_e8;
  printf_size_t local_e0;
  bool local_d9;
  floating_point_t local_d8;
  byte local_cd;
  printf_flags_t local_cc;
  floating_point_t local_c8;
  int local_c0;
  int local_bc;
  double local_b8;
  printf_size_t printed_exponential_start_pos;
  printf_size_t decimal_part_width;
  printf_size_t exp10_part_width;
  int_fast64_t local_98;
  int_fast64_t local_90;
  bool local_85;
  undefined4 local_84;
  undefined1 auStack_80 [3];
  _Bool fall_back_to_decimal_only_mode;
  int original_floored_exp10;
  floating_point_components decimal_part_components;
  floating_point_t p10;
  floating_point_t exp10;
  scaling_factor normalization;
  _Bool abs_exp10_covered_by_powers_table;
  int floored_exp10;
  floating_point_t abs_number;
  _Bool negative;
  printf_size_t len_local;
  char *buf_local;
  printf_flags_t flags_local;
  printf_size_t width_local;
  printf_size_t precision_local;
  floating_point_t number_local;
  output_gadget_t *output_local;
  
  iVar3 = get_sign_bit(number);
  negative_00 = iVar3 != 0;
  local_b8 = number;
  if (negative_00) {
    local_b8 = -number;
  }
  if ((local_b8 != 0.0) || (NAN(local_b8))) {
    x = log10_of_positive(local_b8);
    normalization._12_4_ = bastardized_floor(x);
    decimal_part_components._16_8_ = pow10_of_int(normalization._12_4_);
    if (local_b8 < (double)decimal_part_components._16_8_) {
      normalization._12_4_ = normalization._12_4_ + -1;
      decimal_part_components._16_8_ = (double)decimal_part_components._16_8_ / 10.0;
    }
    if ((int)normalization._12_4_ < 0) {
      local_bc = -normalization._12_4_;
    }
    else {
      local_bc = normalization._12_4_;
    }
    normalization._11_1_ = local_bc < 0x11;
    if ((bool)normalization._11_1_) {
      if ((int)normalization._12_4_ < 0) {
        local_c0 = -normalization._12_4_;
      }
      else {
        local_c0 = normalization._12_4_;
      }
      local_c8 = powers_of_10[local_c0];
    }
    else {
      local_c8 = (floating_point_t)decimal_part_components._16_8_;
    }
    exp10 = local_c8;
  }
  else {
    normalization._12_4_ = 0;
  }
  uVar2 = normalization._12_4_;
  buf_local._4_4_ = flags;
  flags_local = precision;
  if ((flags & 0x1000) != 0) {
    if (precision < 2) {
      local_cc = 0;
    }
    else {
      local_cc = precision - 1;
    }
    flags_local = local_cc;
    buf_local._4_4_ = flags | 0x800;
  }
  local_cd = 0;
  if ((int)normalization._12_4_ < 0) {
    local_cd = normalization._11_1_;
  }
  if (normalization._12_4_ == 0) {
    if (negative_00) {
      local_d8 = -local_b8;
    }
    else {
      local_d8 = local_b8;
    }
    get_components((floating_point_components *)auStack_80,local_d8,flags_local);
  }
  else {
    normalization_00.multiply = (_Bool)(local_cd & 1);
    normalization_00.raw_factor = exp10;
    normalization_00._9_7_ = 0;
    get_normalized_components
              ((floating_point_components *)auStack_80,negative_00,flags_local,local_b8,
               normalization_00,normalization._12_4_);
  }
  local_84 = normalization._12_4_;
  if (9 < _auStack_80) {
    normalization._12_4_ = normalization._12_4_ + 1;
    _auStack_80 = 1;
    decimal_part_components.integral = 0;
  }
  local_d9 = false;
  if (((buf_local._4_4_ & 0x1000) != 0) && (local_d9 = false, -5 < (int)normalization._12_4_)) {
    local_d9 = (int)normalization._12_4_ < (int)(flags_local + 1);
  }
  local_85 = local_d9;
  if (local_d9 != false) {
    if ((int)normalization._12_4_ < (int)flags_local) {
      local_e0 = flags_local - normalization._12_4_;
    }
    else {
      local_e0 = 0;
    }
    flags_local = local_e0;
    if (negative_00) {
      local_e8 = -local_b8;
    }
    else {
      local_e8 = local_b8;
    }
    get_components((floating_point_components *)&decimal_part_width,local_e8,local_e0);
    _auStack_80 = _decimal_part_width;
    decimal_part_components.integral = local_98;
    decimal_part_components.fractional = local_90;
    normalization._12_4_ = uVar2;
    if (((buf_local._4_4_ & 0x1000) != 0) && (-2 < (int)uVar2)) {
      if (((double)_decimal_part_width == powers_of_10[uVar2 + 1]) &&
         ((!NAN((double)_decimal_part_width) && !NAN(powers_of_10[uVar2 + 1]) &&
          (normalization._12_4_ = uVar2 + 1, local_e0 != 0)))) {
        flags_local = local_e0 - 1;
      }
    }
  }
  if ((local_85 & 1U) == 0) {
    if ((int)normalization._12_4_ < 0) {
      local_f0 = -normalization._12_4_;
    }
    else {
      local_f0 = normalization._12_4_;
    }
    local_ec = 5;
    if (local_f0 < 100) {
      local_ec = 4;
    }
  }
  else {
    local_ec = 0;
  }
  if (((buf_local._4_4_ & 2) == 0) || (local_ec == 0)) {
    if (local_ec < width) {
      local_f8 = width - local_ec;
    }
    else {
      local_f8 = 0;
    }
    local_f4 = local_f8;
  }
  else {
    local_f4 = 0;
  }
  pVar1 = output->pos;
  number_.fractional = decimal_part_components.integral;
  number_.integral = _auStack_80;
  number_._16_8_ = decimal_part_components.fractional;
  print_broken_up_decimal(number_,output,flags_local,local_f4,buf_local._4_4_,buf,len);
  if ((local_85 & 1U) == 0) {
    c = 'e';
    if ((buf_local._4_4_ & 0x20) != 0) {
      c = 'E';
    }
    putchar_via_gadget(output,c);
    if ((int)normalization._12_4_ < 1) {
      local_108 = -(long)(int)normalization._12_4_;
    }
    else {
      local_108 = (printf_unsigned_value_t)(int)normalization._12_4_;
    }
    print_integer(output,local_108,(int)normalization._12_4_ < 0,'\n',0,local_ec - 1,5);
    if ((buf_local._4_4_ & 2) != 0) {
      while (output->pos - pVar1 < width) {
        putchar_via_gadget(output,' ');
      }
    }
  }
  return;
}

Assistant:

static void print_exponential_number(output_gadget_t* output, floating_point_t number, printf_size_t precision, printf_size_t width, printf_flags_t flags, char* buf, printf_size_t len)
{
  const bool negative = get_sign_bit(number);
  // This number will decrease gradually (by factors of 10) as we "extract" the exponent out of it
  floating_point_t abs_number =  SIGN(negative, number);

  int floored_exp10;
  bool abs_exp10_covered_by_powers_table;
  struct scaling_factor normalization;


  // Determine the decimal exponent
  if (abs_number == (floating_point_t) 0.0) {
    // TODO: This is a special-case for 0.0 (and -0.0); but proper handling is required for denormals more generally.
    floored_exp10 = 0; // ... and no need to set a normalization factor or check the powers table
  }
  else  {
    floating_point_t exp10 = log10_of_positive(abs_number);
    floored_exp10 = bastardized_floor(exp10);
    floating_point_t p10 = pow10_of_int(floored_exp10);
    // correct for rounding errors
    if (abs_number < p10) {
      floored_exp10--;
      p10 /= 10;
    }
    abs_exp10_covered_by_powers_table = PRINTF_ABS(floored_exp10) < PRINTF_MAX_PRECOMPUTED_POWER_OF_10;
    normalization.raw_factor = abs_exp10_covered_by_powers_table ? powers_of_10[PRINTF_ABS(floored_exp10)] : p10;
  }

  if (flags & FLAGS_ADAPT_EXP) {
    // Note: For now, still assuming we _don't_ fall-back to "%f" mode; we can't decide
    // that until we've established the exact exponent.

    // In "%g" mode, "precision" is the number of _significant digits_; we must
    // "translate" that  to an actual number of decimal digits.
    precision = (precision > 1) ? (precision - 1U) : 0U;
    flags |= FLAGS_PRECISION;   // make sure print_broken_up_decimal respects our choice
  }

  // We now begin accounting for the widths of the two parts of our printed field:
  // the decimal part after decimal exponent extraction, and the base-10 exponent part.
  // For both of these, the value of 0 has a special meaning, but not the same one:
  // a 0 exponent-part width means "don't print the exponent"; a 0 decimal-part width
  // means "use as many characters as necessary".

  normalization.multiply = (floored_exp10 < 0 && abs_exp10_covered_by_powers_table);
  struct floating_point_components decimal_part_components =
    (floored_exp10 == 0) ?
    get_components(SIGN(negative, abs_number), precision) :
    get_normalized_components(negative, precision, abs_number, normalization, floored_exp10);

  // Account for roll-over, e.g. rounding from 9.99 to 100.0 - which effects
  // the exponent and may require additional tweaking of the parts
  // (and saving the floored_exp10 in case we'll need to undo the roll-over).
  int original_floored_exp10 = floored_exp10;
  if (decimal_part_components.integral >= 10) {
    floored_exp10++;
    decimal_part_components.integral = 1;
    decimal_part_components.fractional = 0;
  }

  // Should we want to fall-back to "%f" mode, and only print the decimal part?
  // (and remember we have decreased "precision" by 1
  bool fall_back_to_decimal_only_mode = (flags & FLAGS_ADAPT_EXP) && (floored_exp10 >= -4) && (floored_exp10 < (int) precision + 1);

  if (fall_back_to_decimal_only_mode) {
      precision = ((int) precision > floored_exp10) ? (unsigned) ((int) precision - floored_exp10) : 0U;
    // Redo some work :-)
    floored_exp10 = original_floored_exp10;
    decimal_part_components = get_components(SIGN(negative, abs_number), precision);

    if ((flags & FLAGS_ADAPT_EXP) && floored_exp10 >= -1 && ((double)decimal_part_components.integral == powers_of_10[floored_exp10 + 1])) {
      floored_exp10++; // Not strictly necessary, since floored_exp10 is no longer really used
      if (precision > 0U) { precision--; }
      // ... and it should already be the case that decimal_part_components.fractional == 0
    }
    // TODO: What about rollover strictly within the fractional part?
  }

  // the floored_exp10 format is "E%+03d" and largest possible floored_exp10 value for a 64-bit double
  // is "307" (for 2^1023), so we set aside 4-5 characters overall
  printf_size_t exp10_part_width = fall_back_to_decimal_only_mode ? 0U : (PRINTF_ABS(floored_exp10) < 100) ? 4U : 5U;

  printf_size_t decimal_part_width =
    ((flags & FLAGS_LEFT) && exp10_part_width) ?
      // We're padding on the right, so the width constraint is the exponent part's
      // problem, not the decimal part's, so we'll use as many characters as we need:
      0U :
      // We're padding on the left; so the width constraint is the decimal part's
      // problem. Well, can both the decimal part and the exponent part fit within our overall width?
      ((width > exp10_part_width) ?
        // Yes, so we limit our decimal part's width.
        // (Note this is trivially valid even if we've fallen back to "%f" mode)
        width - exp10_part_width :
        // No; we just give up on any restriction on the decimal part and use as many
        // characters as we need
        0U);

  const printf_size_t printed_exponential_start_pos = output->pos;
  print_broken_up_decimal(decimal_part_components, output, precision, decimal_part_width, flags, buf, len);

  if (! fall_back_to_decimal_only_mode) {
    putchar_via_gadget(output, (flags & FLAGS_UPPERCASE) ? 'E' : 'e');
    print_integer(output,
                  ABS_FOR_PRINTING(floored_exp10),
                  floored_exp10 < 0, 10, 0, exp10_part_width - 1,
                FLAGS_ZEROPAD | FLAGS_PLUS);
    if (flags & FLAGS_LEFT) {
      // We need to right-pad with spaces to meet the width requirement
      while (output->pos - printed_exponential_start_pos < width) {
        putchar_via_gadget(output, ' ');
      }
    }
  }
}